

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::matrix4f>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *result)

{
  pointer *ppmVar1;
  pointer pmVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  ulong uVar6;
  char cVar7;
  matrix4f value;
  char c;
  matrix4f local_90;
  string local_50;
  
  pmVar2 = (result->
           super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>).
      _M_impl.super__Vector_impl_data._M_finish != pmVar2) {
    (result->
    super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>).
    _M_impl.super__Vector_impl_data._M_finish = pmVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    local_90.m[0][0] = 1.0;
    local_90.m[0][1] = 0.0;
    local_90.m[0][2] = 0.0;
    local_90.m[0][3] = 0.0;
    local_90.m[1][0] = 0.0;
    local_90.m[1][1] = 1.0;
    local_90.m[1][2] = 0.0;
    local_90.m[1][3] = 0.0;
    local_90.m[2][0] = 0.0;
    local_90.m[2][1] = 0.0;
    local_90.m[2][2] = 1.0;
    local_90.m[2][3] = 0.0;
    local_90.m[3][0] = 0.0;
    local_90.m[3][1] = 0.0;
    local_90.m[3][2] = 0.0;
    local_90.m[3][3] = 1.0;
    bVar5 = ParseMatrix(this,&local_90);
    if (bVar5) {
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>)
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::matrix4f,std::allocator<tinyusdz::value::matrix4f>>::
        _M_realloc_insert<tinyusdz::value::matrix4f_const&>
                  ((vector<tinyusdz::value::matrix4f,std::allocator<tinyusdz::value::matrix4f>> *)
                   result,iVar3,&local_90);
      }
      else {
        *(ulong *)(iVar3._M_current)->m[3] = CONCAT44(local_90.m[3][1],local_90.m[3][0]);
        *(ulong *)((iVar3._M_current)->m[3] + 2) = CONCAT44(local_90.m[3][3],local_90.m[3][2]);
        *(undefined8 *)(iVar3._M_current)->m[2] = local_90.m[2]._0_8_;
        *(ulong *)((iVar3._M_current)->m[2] + 2) = CONCAT44(local_90.m[2][3],local_90.m[2][2]);
        *(ulong *)(iVar3._M_current)->m[1] = CONCAT44(local_90.m[1][1],local_90.m[1][0]);
        *(undefined8 *)((iVar3._M_current)->m[1] + 2) = local_90.m[1]._8_8_;
        *(ulong *)(iVar3._M_current)->m[0] = CONCAT44(local_90.m[0][1],local_90.m[0][0]);
        *(ulong *)((iVar3._M_current)->m[0] + 2) = CONCAT44(local_90.m[0][3],local_90.m[0][2]);
        ppmVar1 = &(result->
                   super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppmVar1 = *ppmVar1 + 1;
      }
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Not starting with the value of requested type.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar5) {
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_003987d0;
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = Char1(this,(char *)&local_50);
        cVar7 = '\x01';
        if (bVar5) {
          if ((char)local_50._M_dataplus._M_p == sep) {
            bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar5) {
              bVar5 = LookChar1(this,(char *)&local_90);
              cVar7 = (local_90.m[0][0]._0_1_ == end_symbol) * '\x03';
              if (!bVar5) {
                cVar7 = '\x01';
              }
              if (local_90.m[0][0]._0_1_ != end_symbol && bVar5) goto LAB_003986f7;
            }
          }
          else {
LAB_003986f7:
            if ((char)local_50._M_dataplus._M_p == sep) {
              cVar7 = '\x01';
              bVar5 = SkipWhitespaceAndNewline(this,true);
              if (bVar5) {
                local_90.m[0][0] = 1.0;
                local_90.m[0][1] = 0.0;
                local_90.m[0][2] = 0.0;
                local_90.m[0][3] = 0.0;
                local_90.m[1][0] = 0.0;
                local_90.m[1][1] = 1.0;
                local_90.m[1][2] = 0.0;
                local_90.m[1][3] = 0.0;
                local_90.m[2][0] = 0.0;
                local_90.m[2][1] = 0.0;
                local_90.m[2][2] = 1.0;
                local_90.m[2][3] = 0.0;
                local_90.m[3][0] = 0.0;
                local_90.m[3][1] = 0.0;
                local_90.m[3][2] = 0.0;
                local_90.m[3][3] = 1.0;
                bVar5 = ParseMatrix(this,&local_90);
                cVar7 = '\x03';
                if (bVar5) {
                  iVar3._M_current =
                       (result->
                       super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (result->
                      super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::
                    vector<tinyusdz::value::matrix4f,std::allocator<tinyusdz::value::matrix4f>>::
                    _M_realloc_insert<tinyusdz::value::matrix4f_const&>
                              ((vector<tinyusdz::value::matrix4f,std::allocator<tinyusdz::value::matrix4f>>
                                *)result,iVar3,&local_90);
                  }
                  else {
                    *(ulong *)(iVar3._M_current)->m[3] = CONCAT44(local_90.m[3][1],local_90.m[3][0])
                    ;
                    *(ulong *)((iVar3._M_current)->m[3] + 2) =
                         CONCAT44(local_90.m[3][3],local_90.m[3][2]);
                    *(undefined8 *)(iVar3._M_current)->m[2] = local_90.m[2]._0_8_;
                    *(ulong *)((iVar3._M_current)->m[2] + 2) =
                         CONCAT44(local_90.m[2][3],local_90.m[2][2]);
                    *(ulong *)(iVar3._M_current)->m[1] = CONCAT44(local_90.m[1][1],local_90.m[1][0])
                    ;
                    *(undefined8 *)((iVar3._M_current)->m[1] + 2) = local_90.m[1]._8_8_;
                    *(ulong *)(iVar3._M_current)->m[0] = CONCAT44(local_90.m[0][1],local_90.m[0][0])
                    ;
                    *(ulong *)((iVar3._M_current)->m[0] + 2) =
                         CONCAT44(local_90.m[0][3],local_90.m[0][2]);
                    ppmVar1 = &(result->
                               super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppmVar1 = *ppmVar1 + 1;
                  }
                  cVar7 = '\0';
                }
              }
            }
            else {
              pSVar4 = this->_sr;
              cVar7 = '\x03';
              if ((0 < (long)pSVar4->idx_) && (uVar6 = pSVar4->idx_ - 1, uVar6 <= pSVar4->length_))
              {
                pSVar4->idx_ = uVar6;
              }
            }
          }
        }
      } while (cVar7 == '\0');
      if (cVar7 != '\x01') {
LAB_003987d0:
        if ((result->
            super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_90.m[0]._0_8_ = local_90.m + 1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Empty array.\n","");
        PushError(this,(string *)&local_90);
        if ((float (*) [4])local_90.m[0]._0_8_ != local_90.m + 1) {
          operator_delete((void *)local_90.m[0]._0_8_,
                          CONCAT44(local_90.m[1][1],local_90.m[1][0]) + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}